

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.cc
# Opt level: O0

bool benchmark::ParseInt32(string *src_text,char *str,int32_t *value)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  int32_t result;
  long long_value;
  char *end;
  int32_t *value_local;
  char *str_local;
  string *src_text_local;
  
  long_value = 0;
  end = (char *)value;
  value_local = (int32_t *)str;
  str_local = (char *)src_text;
  lVar1 = strtol(str,(char **)&long_value,10);
  if (*(char *)long_value == '\0') {
    lVar3 = std::numeric_limits<long>::max();
    if (((lVar1 != lVar3) && (lVar3 = std::numeric_limits<long>::min(), lVar1 != lVar3)) &&
       ((int)lVar1 == lVar1)) {
      *(int *)end = (int)lVar1;
      return true;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)str_local);
    poVar2 = std::operator<<(poVar2," is expected to be a 32-bit integer, ");
    poVar2 = std::operator<<(poVar2,"but actually has value \"");
    poVar2 = std::operator<<(poVar2,(char *)value_local);
    poVar2 = std::operator<<(poVar2,"\", ");
    std::operator<<(poVar2,"which overflows.\n");
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,(string *)str_local);
    poVar2 = std::operator<<(poVar2," is expected to be a 32-bit integer, ");
    poVar2 = std::operator<<(poVar2,"but actually has value \"");
    poVar2 = std::operator<<(poVar2,(char *)value_local);
    std::operator<<(poVar2,"\".\n");
  }
  return false;
}

Assistant:

bool ParseInt32(const std::string& src_text, const char* str, int32_t* value) {
  // Parses the environment variable as a decimal integer.
  char* end = nullptr;
  const long long_value = strtol(str, &end, 10);  // NOLINT

  // Has strtol() consumed all characters in the string?
  if (*end != '\0') {
    // No - an invalid character was encountered.
    std::cerr << src_text << " is expected to be a 32-bit integer, "
              << "but actually has value \"" << str << "\".\n";
    return false;
  }

  // Is the parsed value in the range of an Int32?
  const int32_t result = static_cast<int32_t>(long_value);
  if (long_value == std::numeric_limits<long>::max() ||
      long_value == std::numeric_limits<long>::min() ||
      // The parsed value overflows as a long.  (strtol() returns
      // LONG_MAX or LONG_MIN when the input overflows.)
      result != long_value
          // The parsed value overflows as an Int32.
      ) {
    std::cerr << src_text << " is expected to be a 32-bit integer, "
              << "but actually has value \"" << str << "\", "
              << "which overflows.\n";
    return false;
  }

  *value = result;
  return true;
}